

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

mpack_node_data_t * mpack_node_map_str_impl(mpack_node_t node,char *str,size_t length)

{
  int iVar1;
  mpack_tree_error_t p_Var2;
  mpack_node_data_t *pmVar3;
  mpack_error_t mVar4;
  mpack_tree_t *pmVar5;
  mpack_node_data_t *pmVar6;
  ulong uVar7;
  bool bVar8;
  
  pmVar5 = node.tree;
  pmVar6 = node.data;
  if (pmVar5->error != mpack_ok) {
    return (mpack_node_data_t *)0x0;
  }
  if (pmVar6->type == mpack_type_map) {
    uVar7 = (ulong)pmVar6->len;
    if (uVar7 == 0) {
      return (mpack_node_data_t *)0x0;
    }
    pmVar3 = (mpack_node_data_t *)((pmVar6->value).i + 0x10);
    pmVar6 = (mpack_node_data_t *)0x0;
    while ((((pmVar3[-1].type != mpack_type_str || (pmVar3[-1].len != length)) ||
            (iVar1 = bcmp(str,pmVar5->data + (long)pmVar3[-1].value.children,length), iVar1 != 0))
           || (bVar8 = pmVar6 == (mpack_node_data_t *)0x0, pmVar6 = pmVar3, bVar8))) {
      pmVar3 = pmVar3 + 2;
      uVar7 = uVar7 - 1;
      if (uVar7 == 0) {
        return pmVar6;
      }
    }
    pmVar5->error = mpack_error_data;
    p_Var2 = pmVar5->error_fn;
    if (p_Var2 == (mpack_tree_error_t)0x0) {
      return (mpack_node_data_t *)0x0;
    }
    mVar4 = mpack_error_data;
  }
  else {
    pmVar5->error = mpack_error_type;
    p_Var2 = pmVar5->error_fn;
    if (p_Var2 == (mpack_tree_error_t)0x0) {
      return (mpack_node_data_t *)0x0;
    }
    mVar4 = mpack_error_type;
  }
  (*p_Var2)(pmVar5,mVar4);
  return (mpack_node_data_t *)0x0;
}

Assistant:

static mpack_node_data_t* mpack_node_map_str_impl(mpack_node_t node, const char* str, size_t length) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    mpack_assert(length == 0 || str != NULL, "str of length %i is NULL", (int)length);

    if (node.data->type != mpack_type_map) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    mpack_tree_t* tree = node.tree;
    mpack_node_data_t* found = NULL;

    for (size_t i = 0; i < node.data->len; ++i) {
        mpack_node_data_t* key = mpack_node_child(node, i * 2);

        if (key->type == mpack_type_str && key->len == length &&
                mpack_memcmp(str, mpack_node_data_unchecked(mpack_node(tree, key)), length) == 0) {
            if (found) {
                mpack_node_flag_error(node, mpack_error_data);
                return NULL;
            }
            found = mpack_node_child(node, i * 2 + 1);
        }
    }

    if (found)
        return found;

    return NULL;
}